

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>::dispose
          (Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *this)

{
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *object;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *ptrCopy;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *this_local;
  
  object = this->ptr;
  if (object != (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    this->ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
    Disposer::dispose<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }